

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O1

void __thiscall curlpp::FormParts::Content::~Content(Content *this)

{
  pointer pcVar1;
  
  (this->super_FormPart)._vptr_FormPart = (_func_int **)&PTR__Content_00133bd0;
  pcVar1 = (this->mContentType)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mContentType).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->mContent)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mContent).field_2) {
    operator_delete(pcVar1);
  }
  (this->super_FormPart)._vptr_FormPart = (_func_int **)&PTR__FormPart_00133b70;
  pcVar1 = (this->super_FormPart).mName._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_FormPart).mName.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

curlpp::FormParts::Content::Content(const char * name, 
				    const char * content, const char * contentType)
  : FormPart(name)
  , mContent(content)
  , mContentType(contentType)
{}